

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall
QRasterPaintEnginePrivate::blitImage
          (QRasterPaintEnginePrivate *this,QPointF *pt,QImage *img,QRect *clip,QRect *sr)

{
  double dVar1;
  QRasterBuffer *pQVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  qsizetype qVar8;
  uchar *puVar9;
  int iVar10;
  int iVar11;
  uchar *__dest;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  iVar4 = (clip->x2).m_i;
  if (((((clip->x1).m_i <= iVar4) && (iVar11 = (clip->y2).m_i, (clip->y1).m_i <= iVar11)) &&
      (dVar1 = pt->xp, dVar1 <= (double)iVar4)) &&
     (((pt->yp <= (double)iVar11 &&
       (iVar4 = QImage::width(img), (double)(clip->x1).m_i <= dVar1 + (double)iVar4)) &&
      (dVar1 = pt->yp, iVar4 = QImage::height(img), (double)(clip->y1).m_i <= (double)iVar4 + dVar1)
      ))) {
    qVar8 = QImage::bytesPerLine(img);
    puVar9 = QImage::bits(img);
    iVar5 = QImage::depth(img);
    iVar6 = QImage::width(img);
    iVar7 = QImage::height(img);
    iVar4 = (sr->x1).m_i;
    iVar11 = (sr->y1).m_i;
    iVar14 = (sr->x2).m_i;
    iVar10 = (sr->y2).m_i;
    if (iVar11 <= iVar10 && iVar4 <= iVar14) {
      iVar6 = (iVar14 - iVar4) + 1;
      iVar7 = (iVar10 - iVar11) + 1;
      puVar9 = puVar9 + (long)(iVar4 * (iVar5 >> 3)) + iVar11 * qVar8;
    }
    iVar10 = (int)((double)((ulong)pt->xp & 0x8000000000000000 | (ulong)DAT_005c3780) + pt->xp);
    iVar4 = (clip->x1).m_i;
    iVar11 = (iVar4 - iVar10) * (iVar5 >> 3);
    iVar5 = 0;
    iVar14 = iVar4 - iVar10;
    if (iVar14 == 0 || iVar4 < iVar10) {
      iVar11 = iVar5;
      iVar4 = iVar10;
      iVar14 = iVar5;
    }
    iVar12 = (clip->x2).m_i + 1;
    iVar13 = (iVar6 - iVar14) + iVar4;
    iVar10 = iVar12 - iVar13;
    if (iVar13 <= iVar12) {
      iVar10 = iVar5;
    }
    iVar10 = iVar10 + (iVar6 - iVar14);
    if (0 < iVar10) {
      puVar9 = puVar9 + iVar11;
      iVar11 = (clip->y1).m_i;
      iVar6 = (clip->y2).m_i + 1;
      iVar14 = (int)((double)((ulong)pt->yp & 0x8000000000000000 | (ulong)DAT_005c3780) + pt->yp);
      iVar5 = iVar11 - iVar14;
      if (iVar5 != 0 && iVar14 <= iVar11) {
        puVar9 = puVar9 + qVar8 * iVar5;
        iVar7 = iVar7 - iVar5;
        iVar14 = iVar11;
      }
      iVar11 = iVar6 - (iVar7 + iVar14);
      if (iVar7 + iVar14 <= iVar6) {
        iVar11 = 0;
      }
      iVar11 = iVar11 + iVar7;
      if (0 < iVar11) {
        pQVar2 = (this->rasterBuffer).d;
        lVar3 = pQVar2->bytes_per_line;
        __dest = pQVar2->m_buffer + iVar14 * lVar3 + (long)iVar4 * (long)pQVar2->bytes_per_pixel;
        iVar4 = qt_depthForFormat(pQVar2->format);
        while (bVar15 = iVar11 != 0, iVar11 = iVar11 + -1, bVar15) {
          memcpy(__dest,puVar9,(long)((iVar4 >> 3) * iVar10));
          __dest = __dest + lVar3;
          puVar9 = puVar9 + qVar8;
        }
      }
    }
  }
  return;
}

Assistant:

void QRasterPaintEnginePrivate::blitImage(const QPointF &pt,
                                          const QImage &img,
                                          const QRect &clip,
                                          const QRect &sr)
{
    if (!clip.isValid())
        return;
    if (pt.x() > qreal(clip.right()) || pt.y() > qreal(clip.bottom()))
        return;
    if ((pt.x() + img.width()) < qreal(clip.left()) || (pt.y() + img.height()) < qreal(clip.top()))
        return;

    Q_ASSERT(img.depth() >= 8);

    qsizetype srcBPL = img.bytesPerLine();
    const uchar *srcBits = img.bits();
    int srcSize = img.depth() >> 3; // This is the part that is incompatible with lower than 8-bit..
    int iw = img.width();
    int ih = img.height();

    if (!sr.isEmpty()) {
        iw = sr.width();
        ih = sr.height();
        // Adjust the image according to the source offset...
        srcBits += ((sr.y() * srcBPL) + sr.x() * srcSize);
    }

    // adapt the x parameters
    int x = qRound(pt.x());
    int cx1 = clip.x();
    int cx2 = clip.x() + clip.width();
    if (x < cx1) {
        int d = cx1 - x;
        srcBits += srcSize * d;
        iw -= d;
        x = cx1;
    }
    if (x + iw > cx2) {
        int d = x + iw - cx2;
        iw -= d;
    }
    if (iw <= 0)
        return;

    // adapt the y parameters...
    int cy1 = clip.y();
    int cy2 = clip.y() + clip.height();
    int y = qRound(pt.y());
    if (y < cy1) {
        int d = cy1 - y;
        srcBits += srcBPL * d;
        ih -= d;
        y = cy1;
    }
    if (y + ih > cy2) {
        int d = y + ih - cy2;
        ih -= d;
    }
    if (ih <= 0)
        return;

    // blit..
    int dstSize = rasterBuffer->bytesPerPixel();
    qsizetype dstBPL = rasterBuffer->bytesPerLine();
    const uint *src = (const uint *) srcBits;
    uint *dst = reinterpret_cast<uint *>(rasterBuffer->buffer() + x * dstSize + y * dstBPL);

    const int len = iw * (qt_depthForFormat(rasterBuffer->format) >> 3);
    for (int y = 0; y < ih; ++y) {
        memcpy(dst, src, len);
        dst = (quint32 *)(((uchar *) dst) + dstBPL);
        src = (const quint32 *)(((const uchar *) src) + srcBPL);
    }
}